

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::CumulativeReporterBase::assertionEnded
          (CumulativeReporterBase *this,AssertionStats *assertionStats)

{
  pointer pPVar1;
  
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pPVar1) {
    std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::push_back
              (&(pPVar1[-1].m_p)->assertions,assertionStats);
    return true;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/catch.hpp"
                ,0x2211,
                "virtual bool Catch::CumulativeReporterBase::assertionEnded(const AssertionStats &)"
               );
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) CATCH_OVERRIDE {
            assert( !m_sectionStack.empty() );
            SectionNode& sectionNode = *m_sectionStack.back();
            sectionNode.assertions.push_back( assertionStats );
            return true;
        }